

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O2

uint __thiscall llvm::StringMapImpl::LookupBucketFor(StringMapImpl *this,StringRef Name)

{
  uint uVar1;
  StringMapEntryBase **ppSVar2;
  StringMapEntryBase *pSVar3;
  long lVar4;
  uint32_t uVar5;
  int iVar6;
  uint32_t in_ECX;
  int iVar7;
  ulong __n;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint32_t uVar12;
  StringRef Buffer;
  ulong uVar13;
  
  __n = Name.Length;
  uVar8 = this->NumBuckets;
  if (uVar8 == 0) {
    init(this,(EVP_PKEY_CTX *)0x10);
    uVar8 = this->NumBuckets;
  }
  Buffer.Length = 0;
  Buffer.Data = (char *)__n;
  uVar5 = djbHash((llvm *)Name.Data,Buffer,in_ECX);
  ppSVar2 = this->TheTable;
  lVar4 = (ulong)this->NumBuckets * 8 + 8;
  uVar1 = this->ItemSize;
  iVar7 = 1;
  uVar10 = 0xffffffffffffffff;
  uVar12 = uVar5;
  do {
    uVar11 = uVar12 & uVar8 - 1;
    uVar13 = (ulong)uVar11;
    pSVar3 = ppSVar2[uVar13];
    uVar9 = (uint)uVar10;
    if (pSVar3 == (StringMapEntryBase *)0x0) {
      if (uVar9 != 0xffffffff) {
        uVar11 = uVar9;
        uVar13 = (long)(int)uVar9;
      }
      *(uint32_t *)((long)ppSVar2 + uVar13 * 4 + lVar4) = uVar5;
      return uVar11;
    }
    if (pSVar3 == (StringMapEntryBase *)0xfffffffffffffff8) {
      uVar10 = uVar10 & 0xffffffff;
      if (uVar9 == 0xffffffff) {
        uVar10 = uVar13;
      }
    }
    else if ((*(uint32_t *)((long)ppSVar2 + uVar13 * 4 + lVar4) == uVar5) && (pSVar3->StrLen == __n)
            ) {
      if (__n == 0) {
        return uVar11;
      }
      iVar6 = bcmp((llvm *)Name.Data,(void *)((long)&pSVar3->StrLen + (ulong)uVar1),__n);
      if (iVar6 == 0) {
        return uVar11;
      }
    }
    uVar12 = uVar11 + iVar7;
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

unsigned StringMapImpl::LookupBucketFor(StringRef Name) {
  unsigned HTSize = NumBuckets;
  if (HTSize == 0) {  // Hash table unallocated so far?
    init(16);
    HTSize = NumBuckets;
  }
  unsigned FullHashValue = djbHash(Name, 0);
  unsigned BucketNo = FullHashValue & (HTSize-1);
  unsigned *HashTable = (unsigned *)(TheTable + NumBuckets + 1);

  unsigned ProbeAmt = 1;
  int FirstTombstone = -1;
  while (true) {
    StringMapEntryBase *BucketItem = TheTable[BucketNo];
    // If we found an empty bucket, this key isn't in the table yet, return it.
    if (LLVM_LIKELY(!BucketItem)) {
      // If we found a tombstone, we want to reuse the tombstone instead of an
      // empty bucket.  This reduces probing.
      if (FirstTombstone != -1) {
        HashTable[FirstTombstone] = FullHashValue;
        return FirstTombstone;
      }

      HashTable[BucketNo] = FullHashValue;
      return BucketNo;
    }

    if (BucketItem == getTombstoneVal()) {
      // Skip over tombstones.  However, remember the first one we see.
      if (FirstTombstone == -1) FirstTombstone = BucketNo;
    } else if (LLVM_LIKELY(HashTable[BucketNo] == FullHashValue)) {
      // If the full hash value matches, check deeply for a match.  The common
      // case here is that we are only looking at the buckets (for item info
      // being non-null and for the full hash value) not at the items.  This
      // is important for cache locality.

      // Do the comparison like this because Name isn't necessarily
      // null-terminated!
      char *ItemStr = (char*)BucketItem+ItemSize;
      if (Name == StringRef(ItemStr, BucketItem->getKeyLength())) {
        // We found a match!
        return BucketNo;
      }
    }

    // Okay, we didn't find the item.  Probe to the next bucket.
    BucketNo = (BucketNo+ProbeAmt) & (HTSize-1);

    // Use quadratic probing, it has fewer clumping artifacts than linear
    // probing and has good cache behavior in the common case.
    ++ProbeAmt;
  }
}